

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O2

void __thiscall
gimage::HighDynamicRangeFusionBase::addMulWeight
          (HighDynamicRangeFusionBase *this,ImageFloat *target,ImageFloat *image,ImageFloat *weight)

{
  float *pfVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  float ***pppfVar5;
  float ***pppfVar6;
  float ***pppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  int d;
  long lVar11;
  long lVar12;
  
  iVar2 = target->depth;
  lVar3 = target->height;
  lVar4 = target->width;
  pppfVar5 = target->img;
  pppfVar6 = image->img;
  pppfVar7 = weight->img;
  for (lVar11 = 0; lVar11 < iVar2; lVar11 = lVar11 + 1) {
    pfVar8 = *pppfVar5[lVar11];
    pfVar9 = *pppfVar6[lVar11];
    pfVar10 = **pppfVar7;
    for (lVar12 = 0; pfVar1 = (float *)((long)pfVar8 + lVar12), pfVar1 < pfVar8 + lVar3 * lVar4;
        lVar12 = lVar12 + 4) {
      *pfVar1 = *(float *)((long)pfVar9 + lVar12) * *(float *)((long)pfVar10 + lVar12) + *pfVar1;
    }
  }
  return;
}

Assistant:

void HighDynamicRangeFusionBase::addMulWeight(ImageFloat &target, ImageFloat &image, ImageFloat &weight)
{
  for (int d=0; d<target.getDepth(); d++)
  {
    float *p=target.getPtr(0, 0, d);
    float *pn=p+target.getWidth()*target.getHeight();
    float *im=image.getPtr(0, 0, d);
    float *w=weight.getPtr(0, 0, 0);

    while (p < pn)
    {
      *p++ += *im++ * *w++;
    }
  }
}